

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::getStandardFormLp
          (Highs *this,HighsInt *num_col,HighsInt *num_row,HighsInt *num_nz,double *offset,
          double *cost,double *rhs,HighsInt *start,HighsInt *index,double *value)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  logHeader(this);
  if (this->standard_form_valid_ == false) {
    formStandardFormLp(this);
  }
  pdVar1 = (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *num_col = (HighsInt)
             ((ulong)((long)(this->standard_form_cost_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar1) >> 3);
  pdVar2 = (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *num_row = (HighsInt)
             ((ulong)((long)(this->standard_form_rhs_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
  piVar3 = (this->standard_form_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  *num_nz = piVar3[*num_col];
  *offset = this->standard_form_offset_;
  for (lVar8 = 0; lVar9 = (long)*num_col, lVar8 < lVar9; lVar8 = lVar8 + 1) {
    if (cost != (double *)0x0) {
      cost[lVar8] = pdVar1[lVar8];
    }
    if (start != (HighsInt *)0x0) {
      start[lVar8] = piVar3[lVar8];
    }
    if (index != (HighsInt *)0x0 || value != (double *)0x0) {
      piVar4 = (this->standard_form_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (this->standard_form_matrix_).value_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (lVar9 = (long)piVar3[lVar8]; lVar9 < piVar3[lVar8 + 1]; lVar9 = lVar9 + 1) {
        if (index != (HighsInt *)0x0) {
          index[lVar9] = piVar4[lVar9];
        }
        if (value != (double *)0x0) {
          value[lVar9] = pdVar5[lVar9];
        }
      }
    }
  }
  if (start != (HighsInt *)0x0) {
    start[lVar9] = piVar3[lVar9];
  }
  if (rhs != (double *)0x0) {
    uVar7 = 0;
    uVar6 = (ulong)(uint)*num_row;
    if (*num_row < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      rhs[uVar7] = pdVar2[uVar7];
    }
  }
  return kOk;
}

Assistant:

HighsStatus Highs::getStandardFormLp(HighsInt& num_col, HighsInt& num_row,
                                     HighsInt& num_nz, double& offset,
                                     double* cost, double* rhs, HighsInt* start,
                                     HighsInt* index, double* value) {
  this->logHeader();
  if (!this->standard_form_valid_) {
    HighsStatus status = formStandardFormLp();
    assert(status == HighsStatus::kOk);
  }
  num_col = this->standard_form_cost_.size();
  num_row = this->standard_form_rhs_.size();
  num_nz = this->standard_form_matrix_.start_[num_col];
  offset = this->standard_form_offset_;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (cost) cost[iCol] = this->standard_form_cost_[iCol];
    if (start) start[iCol] = this->standard_form_matrix_.start_[iCol];
    if (index || value) {
      for (HighsInt iEl = this->standard_form_matrix_.start_[iCol];
           iEl < this->standard_form_matrix_.start_[iCol + 1]; iEl++) {
        if (index) index[iEl] = this->standard_form_matrix_.index_[iEl];
        if (value) value[iEl] = this->standard_form_matrix_.value_[iEl];
      }
    }
  }
  if (start) start[num_col] = this->standard_form_matrix_.start_[num_col];
  if (rhs) {
    for (HighsInt iRow = 0; iRow < num_row; iRow++)
      rhs[iRow] = this->standard_form_rhs_[iRow];
  }
  return HighsStatus::kOk;
}